

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::PerVertexValidationTest::runSeparateShaderTestMode
          (PerVertexValidationTest *this,_test_iteration iteration)

{
  string *out_gs_body_ptr;
  string *out_tc_body_ptr;
  string *out_te_body_ptr;
  GLenum *out_vs_body_ptr;
  undefined1 uVar1;
  bool bVar2;
  ContextType context_type_00;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLenum GVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  long lVar10;
  allocator<char> local_5a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  byte local_57a;
  allocator<char> local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  byte local_552;
  allocator<char> local_551;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  byte local_52a;
  allocator<char> local_529;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  byte local_502;
  allocator<char> local_501;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  MessageBuilder local_4e0;
  string local_360;
  MessageBuilder local_340;
  _shader_stage *local_1c0;
  GLenum *current_so_type_gl;
  GLuint *current_so_id;
  _shader_stage *current_shader_stage;
  string *current_body;
  char *body_raw_ptr;
  uint n_shader;
  ApiType local_180;
  undefined4 local_17c;
  string *psStack_178;
  uint n_shaders;
  _shader shaders [5];
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  _shader_stage used_shader_stages;
  int iStack_2c;
  bool result;
  ContextType min_context_type;
  GLint link_status;
  Functions *gl;
  int local_18;
  ContextType context_type;
  GLint compile_status;
  _test_iteration iteration_local;
  PerVertexValidationTest *this_local;
  
  context_type.super_ApiType.m_bits = (ApiType)(ApiType)iteration;
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  context_type_00.super_ApiType.m_bits = (ApiType)(*pRVar7->_vptr_RenderContext[2])();
  pRVar7 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  _min_context_type = CONCAT44(extraout_var,iVar3);
  glu::ContextType::ContextType((ContextType *)&used_shader_stages);
  fs_body.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)(gs_body.field_2._M_local_buf + 8));
  out_gs_body_ptr = (string *)(&tc_body.field_2._M_allocated_capacity + 1);
  std::__cxx11::string::string((string *)out_gs_body_ptr);
  out_tc_body_ptr = (string *)(&te_body.field_2._M_allocated_capacity + 1);
  std::__cxx11::string::string((string *)out_tc_body_ptr);
  out_te_body_ptr = (string *)(&vs_body.field_2._M_allocated_capacity + 1);
  std::__cxx11::string::string((string *)out_te_body_ptr);
  out_vs_body_ptr = &shaders[4].shader_stage_gl;
  std::__cxx11::string::string((string *)out_vs_body_ptr);
  shaders[0].body_ptr = (string *)&this->m_fs_id;
  shaders[0].so_id_ptr._0_4_ = 1;
  shaders[0].so_id_ptr._4_4_ = 2;
  shaders[0].shader_stage = 0x8b30;
  shaders[1].body_ptr = (string *)&this->m_gs_id;
  shaders[1].so_id_ptr._0_4_ = 2;
  shaders[1].so_id_ptr._4_4_ = 4;
  shaders[1].shader_stage = 0x8dd9;
  shaders[2].body_ptr = (string *)&this->m_tc_id;
  shaders[2].so_id_ptr._0_4_ = 4;
  shaders[2].so_id_ptr._4_4_ = 8;
  shaders[2].shader_stage = 0x8e88;
  shaders[3].body_ptr = (string *)&this->m_te_id;
  shaders[3].so_id_ptr._0_4_ = 8;
  shaders[3].so_id_ptr._4_4_ = 0x10;
  shaders[3].shader_stage = 0x8e87;
  shaders[4].body_ptr = (string *)&this->m_vs_id;
  shaders[4].so_id_ptr._0_4_ = 0x10;
  shaders[4].so_id_ptr._4_4_ = 1;
  shaders[4].shader_stage = 0x8b31;
  local_17c = 5;
  local_180.m_bits = (deUint32)context_type_00.super_ApiType.m_bits;
  psStack_178 = (string *)(gs_body.field_2._M_local_buf + 8);
  shaders[0]._24_8_ = out_gs_body_ptr;
  shaders[1]._24_8_ = out_tc_body_ptr;
  shaders[2]._24_8_ = out_te_body_ptr;
  shaders[3]._24_8_ = out_vs_body_ptr;
  getTestIterationProperties
            (this,context_type_00,(_test_iteration)context_type.super_ApiType.m_bits,
             (ContextType *)&used_shader_stages,(_shader_stage *)(fs_body.field_2._M_local_buf + 8),
             out_gs_body_ptr,out_tc_body_ptr,out_te_body_ptr,(string *)out_vs_body_ptr);
  n_shader = (uint)context_type_00.super_ApiType.m_bits;
  body_raw_ptr._4_4_ = glu::ContextType::getAPI((ContextType *)&used_shader_stages);
  bVar2 = glu::contextSupports((ContextType)n_shader,body_raw_ptr._4_4_);
  if (bVar2) {
    GVar4 = (**(code **)(_min_context_type + 0x3c8))();
    this->m_vs_po_id = GVar4;
    dVar5 = (**(code **)(_min_context_type + 0x800))();
    glu::checkError(dVar5,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xaec);
    for (body_raw_ptr._0_4_ = 0; (uint)body_raw_ptr < 5; body_raw_ptr._0_4_ = (uint)body_raw_ptr + 1
        ) {
      current_body = (string *)0x0;
      current_shader_stage =
           *(_shader_stage **)&shaders[(ulong)(uint)body_raw_ptr - 1].shader_stage_gl;
      current_so_id = (GLuint *)&shaders[(uint)body_raw_ptr].so_id_ptr;
      current_so_type_gl = (GLenum *)shaders[(uint)body_raw_ptr].body_ptr;
      local_1c0 = &shaders[(uint)body_raw_ptr].shader_stage;
      if ((fs_body.field_2._8_4_ & *current_so_id) != 0) {
        current_body = (string *)std::__cxx11::string::c_str();
        GVar6 = (**(code **)(_min_context_type + 0x3f0))(*local_1c0);
        *current_so_type_gl = GVar6;
        dVar5 = (**(code **)(_min_context_type + 0x800))();
        glu::checkError(dVar5,"glCreateShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xafb);
        (**(code **)(_min_context_type + 0x12b8))(*current_so_type_gl,1,&current_body,0);
        dVar5 = (**(code **)(_min_context_type + 0x800))();
        glu::checkError(dVar5,"glShaderSource() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xaff);
        (**(code **)(_min_context_type + 0x248))(*current_so_type_gl);
        dVar5 = (**(code **)(_min_context_type + 0x800))();
        glu::checkError(dVar5,"glCompileShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xb04);
        (**(code **)(_min_context_type + 0xa70))(*current_so_type_gl,0x8b81,&local_18);
        dVar5 = (**(code **)(_min_context_type + 0x800))();
        glu::checkError(dVar5,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xb07);
        if (local_18 != 1) {
          pTVar8 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_340,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
          getShaderStageName_abi_cxx11_(&local_360,this,*current_so_id);
          pMVar9 = tcu::MessageBuilder::operator<<(&local_340,&local_360);
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(char (*) [44])
                                     " unexpectedly failed to compile.\n\nBody:\n>>\n");
          pMVar9 = tcu::MessageBuilder::operator<<
                             (pMVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)current_shader_stage);
          pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [5])"\n<<\n");
          tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_360);
          tcu::MessageBuilder::~MessageBuilder(&local_340);
          goto LAB_011bad3d;
        }
        (**(code **)(_min_context_type + 0x10))(this->m_vs_po_id,*current_so_type_gl);
        dVar5 = (**(code **)(_min_context_type + 0x800))();
        glu::checkError(dVar5,"glAttachShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xb16);
      }
    }
    (**(code **)(_min_context_type + 0x1058))(this->m_vs_po_id,0x8258,1);
    dVar5 = (**(code **)(_min_context_type + 0x800))();
    glu::checkError(dVar5,"glProgramParameteri() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xb1c);
    (**(code **)(_min_context_type + 0xce8))(this->m_vs_po_id);
    dVar5 = (**(code **)(_min_context_type + 0x800))();
    glu::checkError(dVar5,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xb20);
    (**(code **)(_min_context_type + 0x9d8))(this->m_vs_po_id,0x8b82,&stack0xffffffffffffffd4);
    dVar5 = (**(code **)(_min_context_type + 0x800))();
    glu::checkError(dVar5,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xb23);
    if (iStack_2c == 1) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4e0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (&local_4e0,
                          (char (*) [188])
                          "Separable program, consisting of the following separate shaders, was linked successfully, despite incompatible or missing gl_PerVertex block re-declarations.\n\nFragment shader program:\n>>\n"
                         );
      lVar10 = std::__cxx11::string::length();
      local_502 = 0;
      if (lVar10 == 0) {
        std::allocator<char>::allocator();
        local_502 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_500,"[not used]",&local_501);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_500,(string *)(gs_body.field_2._M_local_buf + 8));
      }
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_500);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [33])"\n<<\nGeometry shader program:\n>>\n");
      lVar10 = std::__cxx11::string::length();
      local_52a = 0;
      if (lVar10 == 0) {
        std::allocator<char>::allocator();
        local_52a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,"[not used]",&local_529);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_528,(string *)(tc_body.field_2._M_local_buf + 8));
      }
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_528);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [45])"\n<<\nTessellation control shader program:\n>>\n");
      lVar10 = std::__cxx11::string::length();
      local_552 = 0;
      if (lVar10 == 0) {
        std::allocator<char>::allocator();
        local_552 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_550,"[not used]",&local_551);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_550,(string *)(te_body.field_2._M_local_buf + 8));
      }
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_550);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [48])
                                 "\n<<\nTessellation evaluation shader program:\n>>\n");
      lVar10 = std::__cxx11::string::length();
      local_57a = 0;
      if (lVar10 == 0) {
        std::allocator<char>::allocator();
        local_57a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_578,"[not used]",&local_579);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_578,(string *)(vs_body.field_2._M_local_buf + 8));
      }
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_578);
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(char (*) [31])"\n<<\nVertex shader program:\n>>\n");
      lVar10 = std::__cxx11::string::length();
      if (lVar10 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5a0,"[not used]",&local_5a1);
      }
      else {
        std::__cxx11::string::string((string *)&local_5a0,(string *)&shaders[4].shader_stage_gl);
      }
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_5a0);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_5a0);
      if (lVar10 == 0) {
        std::allocator<char>::~allocator(&local_5a1);
      }
      std::__cxx11::string::~string((string *)&local_578);
      if ((local_57a & 1) != 0) {
        std::allocator<char>::~allocator(&local_579);
      }
      std::__cxx11::string::~string((string *)&local_550);
      if ((local_552 & 1) != 0) {
        std::allocator<char>::~allocator(&local_551);
      }
      std::__cxx11::string::~string((string *)&local_528);
      if ((local_52a & 1) != 0) {
        std::allocator<char>::~allocator(&local_529);
      }
      std::__cxx11::string::~string((string *)&local_500);
      if ((local_502 & 1) != 0) {
        std::allocator<char>::~allocator(&local_501);
      }
      tcu::MessageBuilder::~MessageBuilder(&local_4e0);
    }
    else {
      fs_body.field_2._M_local_buf[0xf] = '\x01';
    }
  }
  else {
    fs_body.field_2._M_local_buf[0xf] = '\x01';
  }
LAB_011bad3d:
  uVar1 = fs_body.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)&shaders[4].shader_stage_gl);
  std::__cxx11::string::~string((string *)(vs_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(te_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(tc_body.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(gs_body.field_2._M_local_buf + 8));
  return (bool)(uVar1 & 1);
}

Assistant:

bool PerVertexValidationTest::runSeparateShaderTestMode(_test_iteration iteration)
{
	glw::GLint			  compile_status;
	glu::ContextType	  context_type = m_context.getRenderContext().getType();
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLint			  link_status;
	glu::ContextType	  min_context_type;
	bool				  result = false;
	_shader_stage		  used_shader_stages;

	std::string fs_body;
	std::string gs_body;
	std::string tc_body;
	std::string te_body;
	std::string vs_body;

	struct _shader
	{
		std::string*  body_ptr;
		glw::GLuint*  so_id_ptr;
		_shader_stage shader_stage;
		glw::GLenum   shader_stage_bit_gl;
		glw::GLenum   shader_stage_gl;
	} shaders[] = { { &fs_body, &m_fs_id, SHADER_STAGE_FRAGMENT, GL_FRAGMENT_SHADER_BIT, GL_FRAGMENT_SHADER },
					{ &gs_body, &m_gs_id, SHADER_STAGE_GEOMETRY, GL_GEOMETRY_SHADER_BIT, GL_GEOMETRY_SHADER },
					{ &tc_body, &m_tc_id, SHADER_STAGE_TESSELLATION_CONTROL, GL_TESS_CONTROL_SHADER_BIT,
					  GL_TESS_CONTROL_SHADER },
					{ &te_body, &m_te_id, SHADER_STAGE_TESSELLATION_EVALUATION, GL_TESS_EVALUATION_SHADER_BIT,
					  GL_TESS_EVALUATION_SHADER },
					{ &vs_body, &m_vs_id, SHADER_STAGE_VERTEX, GL_VERTEX_SHADER_BIT, GL_VERTEX_SHADER } };
	const unsigned int n_shaders = static_cast<const unsigned int>(sizeof(shaders) / sizeof(shaders[0]));

	/* Retrieve iteration properties */
	getTestIterationProperties(context_type, iteration, &min_context_type, &used_shader_stages, &gs_body, &tc_body,
							   &te_body, &vs_body);

	if (!glu::contextSupports(context_type, min_context_type.getAPI()))
	{
		result = true;

		goto end;
	}

	/* Bake a single shader with separate programs defined for all shader stages defined by the iteration
	 * and see what happens.
	 *
	 * For simplicity, we re-use m_vs_po_id to store the program object ID.
	 */
	m_vs_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		const char*			 body_raw_ptr		  = DE_NULL;
		const std::string&   current_body		  = *shaders[n_shader].body_ptr;
		const _shader_stage& current_shader_stage = shaders[n_shader].shader_stage;
		glw::GLuint&		 current_so_id		  = *shaders[n_shader].so_id_ptr;
		const glw::GLenum&   current_so_type_gl   = shaders[n_shader].shader_stage_gl;

		if ((used_shader_stages & current_shader_stage) != 0)
		{
			body_raw_ptr  = current_body.c_str();
			current_so_id = gl.createShader(current_so_type_gl);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

			gl.shaderSource(current_so_id, 1,		 /* count */
							&body_raw_ptr, DE_NULL); /* length */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

			/* Ensure the shader compiled successfully. */
			gl.compileShader(current_so_id);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

			gl.getShaderiv(current_so_id, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			if (compile_status != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << getShaderStageName(current_shader_stage)
								   << " unexpectedly failed to compile.\n"
									  "\nBody:\n>>\n"
								   << current_body << "\n<<\n"
								   << tcu::TestLog::EndMessage;

				goto end;
			}

			/* Attach the shader object to the test program object */
			gl.attachShader(m_vs_po_id, current_so_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");
		} /* if ((used_shader_stages & current_shader_stage) != 0) */
	}	 /* for (all shader objects) */

	/* Mark the program as separable */
	gl.programParameteri(m_vs_po_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramParameteri() call failed.");

	/* Try to link the program and check the result. */
	gl.linkProgram(m_vs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_vs_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status == GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Separable program, consisting of the following separate shaders, was linked "
							  "successfully, despite incompatible or missing gl_PerVertex block re-declarations.\n"
							  "\n"
							  "Fragment shader program:\n>>\n"
						   << ((fs_body.length() > 0) ? fs_body : "[not used]")
						   << "\n<<\nGeometry shader program:\n>>\n"
						   << ((gs_body.length() > 0) ? gs_body : "[not used]")
						   << "\n<<\nTessellation control shader program:\n>>\n"
						   << ((tc_body.length() > 0) ? tc_body : "[not used]")
						   << "\n<<\nTessellation evaluation shader program:\n>>\n"
						   << ((te_body.length() > 0) ? te_body : "[not used]") << "\n<<\nVertex shader program:\n>>\n"
						   << ((vs_body.length() > 0) ? vs_body : "[not used]") << tcu::TestLog::EndMessage;

		goto end;
	} /* if (link_status == GL_TRUE) */

	/* All done */
	result = true;
end:
	return result;
}